

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<std::shared_ptr<cs::name_space>&>>
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,std::shared_ptr<cs::name_space>>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>>
           *this,size_t i,piecewise_construct_t *args,
          tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *args_1,tuple<std::shared_ptr<cs::name_space>_&> *args_2)

{
  __gnu_cxx::new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>>::
  construct<std::pair<std::__cxx11::string,std::shared_ptr<cs::name_space>>,std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string_const&>,std::tuple<std::shared_ptr<cs::name_space>&>>
            ((new_allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<cs::name_space>>> *
             )(this + 0x28),
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<cs::name_space>_>
              *)(i * 0x30 + *(long *)(this + 8)),args,args_1,args_2);
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args)
			{
				PolicyTraits::construct(&alloc_ref(), slots_ + i,
				                        std::forward<Args>(args)...);

#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
				// this check can be costly, so do it only when requested
				assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
				       iterator_at(i) &&
				       "constructed value does not match the lookup key");
#endif
			}